

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createS2N(IRBuilder *this,Value *rhs,string *name)

{
  LiteralType LVar1;
  int iVar2;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_98;
  string local_80;
  LiteralType local_60 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_30;
  ConstantString *value;
  string *name_local;
  Value *rhs_local;
  IRBuilder *this_local;
  
  value = (ConstantString *)name;
  name_local = (string *)rhs;
  rhs_local = (Value *)this;
  LVar1 = Value::type(rhs);
  if (LVar1 == String) {
    if (name_local == (string *)0x0) {
      local_98 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                  *)0x0;
    }
    else {
      local_98 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                  *)__dynamic_cast(name_local,&Value::typeinfo,
                                   &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                    typeinfo,0);
    }
    local_30 = local_98;
    if (local_98 ==
        (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
         *)0x0) {
      local_60[0] = Number;
      makeName(&local_80,this,(string *)value);
      this_local = (IRBuilder *)
                   insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                             (this,local_60,(Value **)&name_local,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
      ::get(&local_50,local_98);
      iVar2 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
      this_local = (IRBuilder *)get(this,(long)iVar2);
      std::__cxx11::string::~string((string *)&local_50);
    }
    return (Value *)this_local;
  }
  __assert_fail("rhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x26b,"Value *flow::IRBuilder::createS2N(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createS2N(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::String);

  if (auto value = dynamic_cast<ConstantString*>(rhs)) {
    try {
      return get(stoi(value->get()));
    } catch (...) {
      // fall through to default behaviour
    }
  }

  return insert<CastInstr>(LiteralType::Number, rhs, makeName(name));
}